

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f *
Matrix4f::orthographicProjection
          (Matrix4f *__return_storage_ptr__,float left,float right,float bottom,float top,
          float zNear,float zFar,bool directX)

{
  float *pfVar1;
  bool directX_local;
  float zFar_local;
  float zNear_local;
  float top_local;
  float bottom_local;
  float right_local;
  float left_local;
  Matrix4f *m;
  
  Matrix4f(__return_storage_ptr__,0.0);
  pfVar1 = operator()(__return_storage_ptr__,0,0);
  *pfVar1 = 2.0 / (right - left);
  pfVar1 = operator()(__return_storage_ptr__,1,1);
  *pfVar1 = 2.0 / (top - bottom);
  pfVar1 = operator()(__return_storage_ptr__,3,3);
  *pfVar1 = 1.0;
  pfVar1 = operator()(__return_storage_ptr__,0,3);
  *pfVar1 = (left + right) / (left - right);
  pfVar1 = operator()(__return_storage_ptr__,1,3);
  *pfVar1 = (top + bottom) / (bottom - top);
  if (directX) {
    pfVar1 = operator()(__return_storage_ptr__,2,2);
    *pfVar1 = 1.0 / (zNear - zFar);
    pfVar1 = operator()(__return_storage_ptr__,2,3);
    *pfVar1 = zNear / (zNear - zFar);
  }
  else {
    pfVar1 = operator()(__return_storage_ptr__,2,2);
    *pfVar1 = 2.0 / (zNear - zFar);
    pfVar1 = operator()(__return_storage_ptr__,2,3);
    *pfVar1 = (zNear + zFar) / (zNear - zFar);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float left, float right, float bottom, float top, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / ( right - left );
	m( 1, 1 ) = 2.0f / ( top - bottom );
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = ( left + right ) / ( left - right );
	m( 1, 3 ) = ( top + bottom ) / ( bottom - top );

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}